

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSha1.c
# Opt level: O1

void deSha1_render(deSha1 *hash,char *buffer)

{
  char cVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  uint uVar5;
  
  bVar2 = 0;
  uVar4 = 0;
  do {
    uVar5 = hash->hash[uVar4 >> 3] >> (~bVar2 & 0x1c) & 0xf;
    cVar1 = (char)uVar5;
    cVar3 = cVar1 + 'W';
    if (uVar5 < 10) {
      cVar3 = cVar1 + '0';
    }
    buffer[uVar4] = cVar3;
    uVar4 = uVar4 + 1;
    bVar2 = bVar2 + 4;
  } while (uVar4 != 0x28);
  return;
}

Assistant:

void deSha1_render (const deSha1* hash, char* buffer)
{
	size_t charNdx;

	for (charNdx = 0; charNdx < 40; charNdx++)
	{
		const deUint32	val32	= hash->hash[charNdx / 8];
		const deUint8	val8	= (deUint8)(0x0fu & (val32 >> (4 * (8 - 1 - (charNdx % 8)))));

		if (val8 < 10)
			buffer[charNdx] = (char)('0' + val8);
		else
			buffer[charNdx] = (char)('a' + val8 - 10);
	}
}